

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O2

void aura_fd_changed_cb(aura_node *node,_func_void_aura_pollfds_ptr_aura_fd_action_void_ptr *cb,
                       void *arg)

{
  list_head *plVar1;
  
  node->fd_changed_arg = arg;
  node->fd_changed_cb = cb;
  if (cb != (_func_void_aura_pollfds_ptr_aura_fd_action_void_ptr *)0x0) {
    plVar1 = &node->fd_list;
    while (plVar1 = plVar1->next, plVar1 != &node->fd_list) {
      (*node->fd_changed_cb)((aura_pollfds *)(plVar1 + -2),AURA_FD_ADDED,node->fd_changed_arg);
    }
  }
  return;
}

Assistant:

void aura_fd_changed_cb(struct aura_node *node,
			void (*cb)(const struct aura_pollfds *fd, enum aura_fd_action act, void *arg),
			void *arg)
{
	node->fd_changed_arg = arg;
	node->fd_changed_cb = cb;
	if (node->fd_changed_cb) {
			const struct aura_pollfds *pos;
			list_for_each_entry(pos, &node->fd_list, qentry) {
				node->fd_changed_cb(pos, AURA_FD_ADDED, node->fd_changed_arg);
			}
	}
}